

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode
N_VWrmsNormMaskVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,N_Vector id,sunrealtype *nrm)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  sunrealtype sVar9;
  double dVar10;
  double dVar11;
  
  if (nvec == 1) {
    sVar9 = N_VWrmsNormMask_Serial(*X,*W,id);
    *nrm = sVar9;
  }
  else {
    uVar1 = *(*X)->content;
    lVar2 = *(long *)((long)id->content + 0x10);
    uVar8 = 0;
    uVar7 = uVar1;
    if ((long)uVar1 < 1) {
      uVar7 = uVar8;
    }
    uVar6 = (ulong)(uint)nvec;
    if (nvec < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      lVar3 = *(long *)((long)X[uVar8]->content + 0x10);
      lVar4 = *(long *)((long)W[uVar8]->content + 0x10);
      nrm[uVar8] = 0.0;
      dVar10 = 0.0;
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        if (0.0 < *(double *)(lVar2 + uVar5 * 8)) {
          dVar11 = *(double *)(lVar3 + uVar5 * 8) * *(double *)(lVar4 + uVar5 * 8);
          dVar10 = dVar10 + dVar11 * dVar11;
          nrm[uVar8] = dVar10;
        }
      }
      dVar10 = dVar10 / (double)(long)uVar1;
      dVar11 = 0.0;
      if (0.0 < dVar10) {
        if (dVar10 < 0.0) {
          dVar11 = sqrt(dVar10);
        }
        else {
          dVar11 = SQRT(dVar10);
        }
      }
      nrm[uVar8] = dVar11;
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormMaskVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                             N_Vector id, sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* wd  = NULL;
  sunrealtype* xd  = NULL;
  sunrealtype* idd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VWrmsNorm */
  if (nvec == 1)
  {
    nrm[0] = N_VWrmsNormMask_Serial(X[0], W[0], id);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and mask data array */
  N   = NV_LENGTH_S(X[0]);
  idd = NV_DATA_S(id);

  /* compute the WRMS norm for each vector in the vector array */
  for (i = 0; i < nvec; i++)
  {
    xd     = NV_DATA_S(X[i]);
    wd     = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j = 0; j < N; j++)
    {
      if (idd[j] > ZERO) { nrm[i] += SUNSQR(xd[j] * wd[j]); }
    }
    nrm[i] = SUNRsqrt(nrm[i] / N);
  }

  return SUN_SUCCESS;
}